

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

bool wasm::tooCostlyToRunUnconditionally(PassOptions *passOptions,Expression *one,Expression *two)

{
  bool bVar1;
  CostAnalyzer local_30;
  CostAnalyzer local_2c;
  
  if (1 < passOptions->shrinkLevel) {
    return false;
  }
  CostAnalyzer::CostAnalyzer(&local_30,one);
  CostAnalyzer::CostAnalyzer(&local_2c,two);
  if (local_2c.cost < local_30.cost) {
    local_2c.cost = local_30.cost;
  }
  bVar1 = tooCostlyToRunUnconditionally(passOptions,local_2c.cost);
  return bVar1;
}

Assistant:

static bool tooCostlyToRunUnconditionally(const PassOptions& passOptions,
                                          Expression* one,
                                          Expression* two) {
  // If we care entirely about code size, just do it for that reason (early
  // exit to avoid work).
  if (passOptions.shrinkLevel >= 2) {
    return false;
  }

  // Consider the cost of executing all the code unconditionally, which adds
  // either the cost of running one or two, so the maximum is the worst case.
  auto max = std::max(CostAnalyzer(one).cost, CostAnalyzer(two).cost);
  return tooCostlyToRunUnconditionally(passOptions, max);
}